

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O3

_Bool trans_LDR_pri(DisasContext_conflict1 *s,arg_rri *a)

{
  _Bool _Var1;
  _Bool extraout_AL;
  int len;
  
  _Var1 = sve_access_check_aarch64(s);
  if (_Var1) {
    len = s->sve_len >> 3;
    do_ldr(s,a->rd * 0x20 + 0x2c10,len,a->rn,a->imm * len);
    return extraout_AL;
  }
  return _Var1;
}

Assistant:

static bool trans_LDR_pri(DisasContext *s, arg_rri *a)
{
    if (sve_access_check(s)) {
        int size = pred_full_reg_size(s);
        int off = pred_full_reg_offset(s, a->rd);
        do_ldr(s, off, size, a->rn, a->imm * size);
    }
    return true;
}